

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-01.cpp
# Opt level: O2

bool __thiscall
baryonyx::itm::
solver_inequalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>
::
push_and_compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
          (solver_inequalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>
           *this,bit_array *x,
          __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          first,__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                last,longdouble kappa,longdouble delta,longdouble theta,
          longdouble objective_amplifier)

{
  rc_data *begin;
  bool bVar1;
  uint r_size;
  bool bVar2;
  long lVar3;
  long lVar4;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  int k;
  int selected;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  longdouble local_68;
  longdouble local_58;
  longdouble local_48;
  
  local_48 = kappa;
  local_58 = delta;
  local_68 = theta;
  fmt._M_str = "push-update-row {} {} {}\n";
  fmt._M_len = 0x19;
  debug_logger<true>::log<long_double,long_double,long_double>
            ((debug_logger<true> *)this,fmt,&local_48,&local_58,&local_68);
  bVar2 = false;
  while( true ) {
    if (first._M_current == last._M_current) {
      return bVar2;
    }
    k = (first._M_current)->first;
    if (*(int *)(this + 0x78) <= k) break;
    sparse_matrix<int>::row((sparse_matrix<int> *)&it,(int)this + 0x10);
    solver_inequalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
    ::decrease_preference
              ((solver_inequalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
                *)this,it.
                       super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                       .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                       _M_head_impl,
               (row_iterator)
               it.
               super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
               .super__Tuple_impl<1UL,_baryonyx::sparse_matrix<int>::row_value_*>.
               super__Head_base<1UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl,
               local_68);
    r_size = solver_inequalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
             ::compute_reduced_costs<baryonyx::bit_array>
                       ((solver_inequalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
                         *)this,it.
                                super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                                .
                                super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                                ._M_head_impl,
                        (row_iterator)
                        it.
                        super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                        .super__Tuple_impl<1UL,_baryonyx::sparse_matrix<int>::row_value_*>.
                        super__Head_base<1UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                        _M_head_impl,x);
    begin = *(rc_data **)(this + 0x58);
    lVar4 = *(long *)(this + 0x70);
    for (lVar3 = 0; (ulong)r_size << 5 != lVar3; lVar3 = lVar3 + 0x20) {
      *(longdouble *)((long)&begin->value + lVar3) =
           *(longdouble *)((long)&begin->value + lVar3) +
           *(longdouble *)(*(long *)(lVar4 + 8) + (long)*(int *)((long)&begin->id + lVar3) * 0x10) *
           objective_amplifier;
    }
    calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_inequalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*>
              (begin,begin + (int)r_size,*(random_engine **)(this + 8));
    selected = solver_inequalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
               ::select_variables((solver_inequalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
                                   *)this,r_size,*(int *)(*(long *)(this + 0x60) + (long)k * 8),
                                  *(int *)(*(long *)(this + 0x60) + 4 + (long)k * 8));
    fmt_00._M_str = "constraints {}: {} <= ";
    fmt_00._M_len = 0x16;
    debug_logger<true>::log<int,int>
              ((debug_logger<true> *)this,fmt_00,&k,(int *)((long)k * 8 + *(long *)(this + 0x60)));
    for (lVar4 = 0; (ulong)(~((int)r_size >> 0x1f) & r_size) << 5 != lVar4; lVar4 = lVar4 + 0x20) {
      fmt_01._M_str = "({} {}) ";
      fmt_01._M_len = 8;
      debug_logger<true>::log<long_double,int>
                ((debug_logger<true> *)this,fmt_01,(longdouble *)(*(long *)(this + 0x58) + lVar4),
                 (int *)(*(long *)(this + 0x58) + 0x10 + lVar4));
    }
    fmt_02._M_str = "<= {} => Selected: {}\n";
    fmt_02._M_len = 0x16;
    debug_logger<true>::log<int,int>
              ((debug_logger<true> *)this,fmt_02,(int *)(*(long *)(this + 0x60) + 4 + (long)k * 8),
               &selected);
    bVar1 = affect<baryonyx::itm::solver_inequalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,long_double>
                      ((solver_inequalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
                        *)this,x,
                       it.
                       super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                       .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                       _M_head_impl,k,selected,r_size,local_48,local_58);
    bVar2 = (bool)(bVar2 | bVar1);
    first._M_current = first._M_current + 1;
  }
  details::fail_fast("Precondition","k < m",
                     "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/itm-solver-inequalities-01.cpp"
                     ,"224");
}

Assistant:

bool push_and_compute_update_row(Xtype& x,
                                     Iterator first,
                                     Iterator last,
                                     Float kappa,
                                     Float delta,
                                     Float theta,
                                     Float objective_amplifier)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("push-update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            bx_expects(k < m);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto r_size =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            // Before sort and select variables, we apply the push method: for
            // each reduces cost, we had the cost multiply with an objective
            // amplifier.

            for (int i = 0; i != r_size; ++i)
                R[i].value += objective_amplifier * c(R[i].id, x);

            calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
            int selected = select_variables(r_size, b[k].min, b[k].max);

            logger::log("constraints {}: {} <= ", k, b[k].min);

            for (int i = 0; i < r_size; ++i)
                logger::log("({} {}) ", R[i].value, R[i].id);

            logger::log("<= {} => Selected: {}\n", b[k].max, selected);

            auto pi_change = affect(
              *this, x, std::get<0>(it), k, selected, r_size, kappa, delta);

            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }